

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v8::detail::
         write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>
                   (appender out,decimal_fp<float> *fp,basic_format_specs<char> *specs,
                   float_specs fspecs,char decimal_point)

{
  uint uVar1;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  int num_zeros;
  sign_t sign;
  int significand_size;
  significand_type significand;
  bool pointy;
  int exp;
  anon_class_28_7_94dcc806 write;
  undefined1 local_7d [5];
  sign_t local_78;
  int local_74;
  undefined1 local_70 [8];
  float_specs local_68;
  undefined1 local_5c [4];
  anon_class_56_7_a2a26a24 local_58;
  
  local_70._0_4_ = fp->significand;
  uVar7 = 0x1f;
  if ((local_70._0_4_ | 1) != 0) {
    for (; (local_70._0_4_ | 1) >> uVar7 == 0; uVar7 = uVar7 - 1) {
    }
  }
  local_74 = (int)((ulong)(uint)local_70._0_4_ +
                   *(long *)(count_digits_inc(int)::table + (ulong)uVar7 * 8) >> 0x20);
  local_68._4_4_ = fspecs._4_4_;
  local_78 = (uint)local_68._4_4_ >> 8 & 0xff;
  uVar4 = (ulong)((uint)(local_78 != none) + local_74);
  uVar1 = fp->exponent;
  local_5c = (undefined1  [4])(uVar1 + local_74);
  iVar8 = fspecs.precision;
  local_7d[0] = decimal_point;
  local_68 = fspecs;
  if (fspecs._4_1_ == '\x01') {
LAB_00112792:
    iVar9 = uVar1 + local_74 + -1;
    if (((uint)local_68._4_4_ >> 0x14 & 1) == 0) {
      uVar6 = 0;
      if (local_74 == 1) {
        local_7d[0] = '\0';
      }
    }
    else {
      uVar6 = 0;
      if (0 < iVar8 - local_74) {
        uVar6 = (ulong)(uint)(iVar8 - local_74);
      }
      uVar4 = uVar4 + uVar6;
    }
    local_58.sign =
         (sign_t *)(CONCAT44(local_70._0_4_,(uint)local_68._4_4_ >> 8) & 0xffffffff000000ff);
    local_58.significand._0_5_ = CONCAT14(local_7d[0],local_74);
    local_58.significand_size =
         (int *)(CONCAT35(local_58.significand_size._5_3_,
                          CONCAT14((((uint)local_68._4_4_ >> 0x10 & 1) == 0) << 5,(int)uVar6)) |
                0x4500000000);
    local_58.fp = (decimal_fp<float> *)CONCAT44(local_58.fp._4_4_,iVar9);
    if (specs->width < 1) {
      bVar2.container =
           (buffer<char> *)
           write_float<fmt::v8::appender,_fmt::v8::detail::dragonbox::decimal_fp<float>,_char>::
           anon_class_28_7_94dcc806::operator()
                     ((anon_class_28_7_94dcc806 *)&local_58,
                      out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
    }
    else {
      if ((int)local_5c < 1) {
        iVar9 = 1 - (int)local_5c;
      }
      lVar5 = 2;
      if (99 < iVar9) {
        lVar5 = (ulong)(999 < iVar9) + 3;
      }
      sVar3 = uVar4 + (3 - (ulong)(local_7d[0] == '\0')) + lVar5;
      bVar2.container =
           (buffer<char> *)
           write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,char)::_lambda(fmt::v8::appender)_1_&>
                     (out,specs,sVar3,sVar3,(anon_class_28_7_94dcc806 *)&local_58);
    }
  }
  else {
    if (((ulong)fspecs & 0xff00000000) == 0) {
      iVar9 = 0x10;
      if (0 < iVar8) {
        iVar9 = iVar8;
      }
      if (((int)local_5c < -3) || (iVar9 < (int)local_5c)) goto LAB_00112792;
    }
    if ((int)uVar1 < 0) {
      if ((int)local_5c < 1) {
        iVar9 = -(int)local_5c;
        local_7d._1_4_ = iVar9;
        if (SBORROW4(iVar8,iVar9) != iVar8 + (int)local_5c < 0) {
          local_7d._1_4_ = iVar8;
        }
        if (iVar8 < 0) {
          local_7d._1_4_ = iVar9;
        }
        bVar10 = (ulong)(uint)local_70._0_4_ +
                 *(long *)(count_digits_inc(int)::table + (ulong)uVar7 * 8) >> 0x20 != 0;
        if (bVar10) {
          local_7d._1_4_ = iVar9;
        }
        uVar7 = 1;
        if (local_7d._1_4_ == 0 && !bVar10) {
          uVar7 = (uint)local_68._4_4_ >> 0x14 & 1;
        }
        local_58.significand = (significand_type *)(local_70 + 7);
        local_70[7] = (undefined1)uVar7;
        sVar3 = uVar4 + (local_7d._1_4_ + uVar7 + 1);
        local_58.sign = &local_78;
        local_58.significand_size = (int *)local_7d;
        local_58.fp = (decimal_fp<float> *)(local_7d + 1);
        local_58.fspecs = (float_specs *)local_70;
        local_58.decimal_point = (char *)&local_74;
        bVar2.container =
             (buffer<char> *)
             write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,char)::_lambda(fmt::v8::appender)_4_&>
                       (out,specs,sVar3,sVar3,(anon_class_48_6_d9b5e731 *)&local_58);
      }
      else {
        local_7d._1_4_ = iVar8 - local_74 & (int)(local_68._4_4_ << 0xb) >> 0x1f;
        local_58.decimal_point = local_7d + 1;
        uVar6 = (ulong)(uint)local_7d._1_4_;
        if ((int)local_7d._1_4_ < 1) {
          uVar6 = 0;
        }
        sVar3 = uVar4 + uVar6 + 1;
        local_58.sign = &local_78;
        local_58.significand = (significand_type *)local_70;
        local_58.significand_size = &local_74;
        local_58.fp = (decimal_fp<float> *)local_5c;
        local_58.fspecs = (float_specs *)local_7d;
        bVar2.container =
             (buffer<char> *)
             write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,char)::_lambda(fmt::v8::appender)_3_&>
                       (out,specs,sVar3,sVar3,(anon_class_48_6_48d028d1 *)&local_58);
      }
    }
    else {
      sVar3 = uVar4 + uVar1;
      local_7d._1_4_ = iVar8 - (int)local_5c;
      if (((uint)local_68._4_4_ >> 0x14 & 1) != 0) {
        if ((fspecs._4_1_ != '\x02') && ((int)local_7d._1_4_ < 1)) {
          local_7d._1_4_ = 1;
        }
        if (0 < (int)local_7d._1_4_) {
          sVar3 = sVar3 + (uint)local_7d._1_4_ + 1;
        }
      }
      local_58.sign = &local_78;
      local_58.significand = (significand_type *)local_70;
      local_58.significand_size = &local_74;
      local_58.fspecs = &local_68;
      local_58.decimal_point = local_7d;
      local_58.num_zeros = (int *)(local_7d + 1);
      local_58.fp = fp;
      bVar2.container =
           (buffer<char> *)
           write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,char)::_lambda(fmt::v8::appender)_2_&>
                     (out,specs,sVar3,sVar3,&local_58);
    }
  }
  return (appender)bVar2.container;
}

Assistant:

auto write_float(OutputIt out, const DecimalFP& fp,
                 const basic_format_specs<Char>& specs, float_specs fspecs,
                 Char decimal_point) -> OutputIt {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros) + 1;
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = detail::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}